

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyTools.h
# Opt level: O0

void Assimp::NewellNormal<3,3,3,double>
               (aiVector3t<double> *out,int num,double *x,double *y,double *z)

{
  aiVector3t<double> local_b0;
  int local_94;
  double *pdStack_90;
  int tmp;
  double *zhigh;
  double *zlow;
  double *zptr;
  double *yhigh;
  double *ylow;
  double *yptr;
  double *xhigh;
  double *xlow;
  double *xptr;
  double sum_zx;
  double sum_yz;
  double sum_xy;
  double *z_local;
  double *y_local;
  double *x_local;
  aiVector3t<double> *paStack_10;
  int num_local;
  aiVector3t<double> *out_local;
  
  x[num * 3] = *x;
  x[(num + 1) * 3] = x[3];
  y[num * 3] = *y;
  y[(num + 1) * 3] = y[3];
  z[num * 3] = *z;
  z[(num + 1) * 3] = z[3];
  sum_yz = 0.0;
  sum_zx = 0.0;
  xptr = (double *)0x0;
  xlow = x + 3;
  yptr = x + 6;
  ylow = y + 3;
  zptr = y + 6;
  zlow = z + 3;
  pdStack_90 = z + 6;
  zhigh = z;
  yhigh = y;
  xhigh = x;
  for (local_94 = 0; local_94 < num; local_94 = local_94 + 1) {
    sum_yz = *xlow * (*zptr - *yhigh) + sum_yz;
    sum_zx = *ylow * (*pdStack_90 - *zhigh) + sum_zx;
    xptr = (double *)(*zlow * (*yptr - *xhigh) + (double)xptr);
    xlow = xlow + 3;
    xhigh = xhigh + 3;
    yptr = yptr + 3;
    ylow = ylow + 3;
    yhigh = yhigh + 3;
    zptr = zptr + 3;
    zlow = zlow + 3;
    zhigh = zhigh + 3;
    pdStack_90 = pdStack_90 + 3;
  }
  sum_xy = (double)z;
  z_local = y;
  y_local = x;
  x_local._4_4_ = num;
  paStack_10 = out;
  aiVector3t<double>::aiVector3t(&local_b0,sum_zx,(double)xptr,sum_yz);
  paStack_10->x = local_b0.x;
  paStack_10->y = local_b0.y;
  paStack_10->z = local_b0.z;
  return;
}

Assistant:

inline void NewellNormal (aiVector3t<TReal>& out, int num, TReal* x, TReal* y, TReal* z)
{
    // Duplicate the first two vertices at the end
    x[(num+0)*ofs_x] = x[0];
    x[(num+1)*ofs_x] = x[ofs_x];

    y[(num+0)*ofs_y] = y[0];
    y[(num+1)*ofs_y] = y[ofs_y];

    z[(num+0)*ofs_z] = z[0];
    z[(num+1)*ofs_z] = z[ofs_z];

    TReal sum_xy = 0.0, sum_yz = 0.0, sum_zx = 0.0;

    TReal *xptr = x +ofs_x, *xlow = x, *xhigh = x + ofs_x*2;
    TReal *yptr = y +ofs_y, *ylow = y, *yhigh = y + ofs_y*2;
    TReal *zptr = z +ofs_z, *zlow = z, *zhigh = z + ofs_z*2;

    for (int tmp=0; tmp < num; tmp++) {
        sum_xy += (*xptr) * ( (*yhigh) - (*ylow) );
        sum_yz += (*yptr) * ( (*zhigh) - (*zlow) );
        sum_zx += (*zptr) * ( (*xhigh) - (*xlow) );

        xptr  += ofs_x;
        xlow  += ofs_x;
        xhigh += ofs_x;

        yptr  += ofs_y;
        ylow  += ofs_y;
        yhigh += ofs_y;

        zptr  += ofs_z;
        zlow  += ofs_z;
        zhigh += ofs_z;
    }
    out = aiVector3t<TReal>(sum_yz,sum_zx,sum_xy);
}